

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitSVTest_single_word_trailing_delim_Test<char8_t>::TestBody
          (SplitSVTest_single_word_trailing_delim_Test<char8_t> *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_f8 [8];
  Message local_f0 [12];
  int local_e4;
  size_type local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0 [12];
  int local_b4;
  size_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [12];
  int local_84;
  size_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> single_word;
  undefined1 local_30 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> word;
  SplitSVTest_single_word_trailing_delim_Test<char8_t> *this_local;
  
  word.field_2._8_8_ = this;
  make_word<char8_t,std::__cxx11::u8string>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_30,
             8,'\0');
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator+=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_30,
             '\0');
  join_0x00000010_0x00000000_ =
       std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)local_30);
  jessilib::split<std::vector,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
            ((container_type_conflict3 *)&gtest_ar.message_,
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)
             &split_result.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,'\0');
  local_80 = std::
             vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&gtest_ar.message_);
  local_84 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_78,"split_result.size()","2",&local_80,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                         *)&gtest_ar.message_,0);
  local_b0 = std::__cxx11::
             basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::size
                       (pvVar3);
  local_b4 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_a8,"split_result[0].size()","8",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                         *)&gtest_ar.message_,1);
  local_e0 = std::__cxx11::
             basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::size
                       (pvVar3);
  local_e4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_d8,"split_result[1].size()","0",&local_e0,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)&gtest_ar.message_);
  std::__cxx11::u8string::~u8string((u8string *)local_30);
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 8);
	EXPECT_EQ(split_result[1].size(), 0);
}